

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O3

MSize lj_tab_len(GCtab *t)

{
  uint key;
  ulong uVar1;
  cTValue *pcVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar6 = t->asize;
  if ((uVar6 < 2) ||
     (uVar1 = (ulong)(t->array).ptr32, *(int *)(uVar1 + 4 + (ulong)(uVar6 - 1) * 8) != -1)) {
    uVar3 = uVar6 - 1;
    if (uVar6 == 0) {
      uVar3 = 0;
    }
    if (t->hmask != 0) {
      uVar4 = uVar3 + 1;
      do {
        key = uVar4;
        if (key < uVar6) {
          pcVar2 = (cTValue *)((ulong)(t->array).ptr32 + (long)(int)key * 8);
        }
        else {
          pcVar2 = lj_tab_getinth(t,key);
        }
        if ((pcVar2 == (cTValue *)0x0) || ((pcVar2->field_2).it == 0xffffffff)) {
          uVar4 = key - uVar3;
          while (1 < uVar4) {
            uVar4 = uVar3 + key >> 1;
            if (uVar4 < uVar6) {
              pcVar2 = (cTValue *)((ulong)(t->array).ptr32 + (ulong)uVar4 * 8);
            }
            else {
              pcVar2 = lj_tab_getinth(t,uVar4);
            }
            uVar5 = uVar4;
            if ((pcVar2 != (cTValue *)0x0) && ((pcVar2->field_2).it != 0xffffffff)) {
              uVar5 = key;
              uVar3 = uVar4;
            }
            key = uVar5;
            uVar4 = uVar5 - uVar3;
          }
          return uVar3;
        }
        uVar4 = key * 2;
        uVar3 = key;
      } while (key * 2 < 0x7ffffffe);
      uVar4 = 0;
      do {
        uVar3 = uVar4;
        uVar4 = uVar3 + 1;
        if (uVar4 < uVar6) {
          pcVar2 = (cTValue *)((ulong)(t->array).ptr32 + (long)(int)uVar4 * 8);
        }
        else {
          pcVar2 = lj_tab_getinth(t,uVar4);
        }
      } while ((pcVar2 != (cTValue *)0x0) && ((pcVar2->field_2).it != 0xffffffff));
    }
  }
  else {
    uVar3 = 0;
    if (uVar6 - 3 < 0xfffffffe) {
      uVar3 = 1;
      do {
        uVar4 = uVar3 + uVar6 >> 1;
        if (*(int *)(uVar1 + 4 + (ulong)(uVar4 - 1) * 8) != -1) {
          uVar3 = uVar4;
          uVar4 = uVar6;
        }
        uVar6 = uVar4;
      } while (1 < uVar6 - uVar3);
      uVar3 = uVar3 - 1;
    }
  }
  return uVar3;
}

Assistant:

MSize LJ_FASTCALL lj_tab_len(GCtab *t)
{
  MSize j = (MSize)t->asize;
  if (j > 1 && tvisnil(arrayslot(t, j-1))) {
    MSize i = 1;
    while (j - i > 1) {
      MSize m = (i+j)/2;
      if (tvisnil(arrayslot(t, m-1))) j = m; else i = m;
    }
    return i-1;
  }
  if (j) j--;
  if (t->hmask <= 0)
    return j;
  return unbound_search(t, j);
}